

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

bool __thiscall cfd::Psbt::IsFindTxIn(Psbt *this,OutPoint *outpoint,uint32_t *index)

{
  undefined4 uVar1;
  undefined4 *in_RDX;
  long in_RDI;
  string errmsg;
  CfdException *except;
  uint32_t temp_index;
  undefined1 local_48 [40];
  undefined4 *local_20;
  
  local_20 = in_RDX;
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)(in_RDI + 0x10),(uint)local_48);
  core::Txid::~Txid((Txid *)0x3c3cea);
  if (local_20 != (undefined4 *)0x0) {
    *local_20 = uVar1;
  }
  return true;
}

Assistant:

bool Psbt::IsFindTxIn(const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index =
        base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}